

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

void lyd_wd_update_parents(lyd_node *node)

{
  lys_node *plVar1;
  long lVar2;
  lyd_node *local_20;
  lyd_node *iter;
  lyd_node *parent;
  lyd_node *node_local;
  
  iter = node->parent;
  parent = node;
  while( true ) {
    if ((((iter == (lyd_node *)0x0) || ((iter->field_0x9 & 1) != 0)) ||
        (iter->schema->nodetype != LYS_CONTAINER)) ||
       (plVar1 = iter->schema, lVar2._0_2_ = plVar1[1].flags, lVar2._2_1_ = plVar1[1].ext_size,
       lVar2._3_1_ = plVar1[1].iffeature_size, lVar2._4_1_ = plVar1[1].padding[0],
       lVar2._5_1_ = plVar1[1].padding[1], lVar2._6_1_ = plVar1[1].padding[2],
       lVar2._7_1_ = plVar1[1].padding[3], lVar2 != 0)) {
      return;
    }
    for (local_20 = parent->prev; (local_20 != parent && ((local_20->field_0x9 & 1) != 0));
        local_20 = local_20->prev) {
    }
    if (local_20 != parent) break;
    if (parent->prev == parent) {
      return;
    }
    parent = parent->parent;
    parent->field_0x9 = parent->field_0x9 & 0xfe | 1;
    iter = parent->parent;
  }
  return;
}

Assistant:

static void
lyd_wd_update_parents(struct lyd_node *node)
{
    struct lyd_node *parent = node->parent, *iter;

    for (parent = node->parent; parent; parent = node->parent) {
        if (parent->dflt || parent->schema->nodetype != LYS_CONTAINER ||
                ((struct lys_node_container *)parent->schema)->presence) {
            /* parent is already default and there is nothing to update or
             * it is not a non-presence container -> stop the loop */
            break;
        }
        /* check that there is still some non default sibling */
        for (iter = node->prev; iter != node; iter = iter->prev) {
            if (!iter->dflt) {
                break;
            }
        }
        if (iter == node && node->prev != node) {
            /* all siblings are implicit default nodes, propagate it to the parent */
            node = node->parent;
            node->dflt = 1;
            continue;
        } else {
            /* stop the loop */
            break;
        }
    }
}